

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O3

void cbtCollisionWorld::objectQuerySingleInternal
               (cbtConvexShape *castShape,cbtTransform *convexFromTrans,cbtTransform *convexToTrans,
               cbtCollisionObjectWrapper *colObjWrap,ConvexResultCallback *resultCallback,
               cbtScalar allowedPenetration)

{
  undefined8 *puVar1;
  ulong *puVar2;
  cbtScalar *pcVar3;
  cbtScalar cVar4;
  undefined8 uVar5;
  ulong uVar6;
  cbtStaticPlaneShape *plane;
  cbtTransform *this;
  cbtDbvt *this_00;
  long lVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  char cVar12;
  int iVar13;
  long lVar14;
  cbtConvexCast *this_01;
  long lVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  cbtScalar cVar21;
  cbtScalar cVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  cbtVector3 boxMinLocal_1;
  cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;
  cbtContinuousConvexCollision convexCaster1;
  cbtVector3 boxMaxLocal_1;
  LocalConvexResult localConvexResult;
  cbtTransform worldTocollisionObject;
  cbtVoronoiSimplexSolver simplexSolver;
  cbtVector3 local_418;
  cbtVector3 local_408;
  cbtCollisionObject *local_3f8;
  float local_3ec;
  undefined1 local_3e8 [8];
  undefined8 uStack_3e0;
  cbtVector3 local_3b8;
  undefined1 local_3a8 [8];
  undefined8 uStack_3a0;
  cbtConvexPenetrationDepthSolver *local_398;
  cbtConvexShape *pcStack_390;
  cbtConvexShape *local_388;
  undefined4 uStack_380;
  undefined4 uStack_37c;
  float local_378;
  undefined8 uStack_374;
  undefined4 local_36c;
  undefined1 local_368 [8];
  cbtVoronoiSimplexSolver *pcStack_360;
  undefined8 local_358;
  cbtVoronoiSimplexSolver *pcStack_350;
  cbtScalar local_348;
  float fStack_344;
  cbtScalar acStack_340 [2];
  float local_338;
  float fStack_334;
  float afStack_330 [20];
  cbtConvexPenetrationDepthSolver *local_2e0;
  float fStack_2d8;
  undefined4 uStack_2d4;
  cbtConvexShape *local_2d0;
  undefined8 uStack_2c8;
  cbtScalar local_2c0;
  undefined8 local_2b8;
  cbtScalar local_2b0;
  undefined8 local_2ac;
  undefined1 local_298 [16];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  cbtScalar local_238;
  cbtScalar cStack_234;
  cbtScalar cStack_230;
  cbtScalar cStack_22c;
  cbtScalar local_228;
  cbtScalar cStack_224;
  cbtScalar cStack_220;
  cbtScalar cStack_21c;
  cbtScalar local_218;
  cbtScalar cStack_214;
  cbtScalar cStack_210;
  cbtScalar cStack_20c;
  cbtScalar local_208;
  cbtScalar cStack_204;
  cbtScalar cStack_200;
  cbtScalar cStack_1fc;
  float local_1f8;
  float fStack_1f4;
  undefined8 uStack_1f0;
  cbtScalar local_1e8;
  cbtScalar cStack_1e4;
  cbtScalar cStack_1e0;
  cbtScalar cStack_1dc;
  cbtScalar local_1d8;
  cbtScalar cStack_1d4;
  cbtScalar cStack_1d0;
  cbtScalar cStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  cbtConvexShape *local_188;
  cbtTransform *local_180;
  cbtTransform *local_178;
  cbtScalar local_170;
  cbtScalar local_16c;
  undefined1 local_168 [16];
  ConvexResultCallback *local_158;
  _func_int **local_110;
  float fStack_108;
  cbtScalar cStack_104;
  cbtScalar local_100 [2];
  cbtScalar acStack_f8 [2];
  cbtScalar local_f0;
  cbtScalar local_e8 [3];
  cbtScalar local_dc [5];
  cbtScalar local_c8;
  cbtScalar local_c0;
  ConvexResultCallback *local_b8;
  cbtCollisionObject *local_b0;
  cbtStaticPlaneShape *local_a8;
  cbtScalar local_64;
  cbtUsageBitfield local_4c [14];
  undefined1 auVar31 [16];
  
  plane = (cbtStaticPlaneShape *)colObjWrap->m_shape;
  this = colObjWrap->m_worldTransform;
  iVar13 = (plane->super_cbtConcaveShape).super_cbtCollisionShape.m_shapeType;
  if (iVar13 < 0x18) {
    local_368 = (undefined1  [8])&PTR_DebugDraw_00b48020;
    local_2b8 = 0;
    local_2ac = 0x38d1b71700000020;
    local_2c0 = resultCallback->m_closestHitFraction;
    local_64 = 0.0001;
    local_4c[0]._0_1_ = 0;
    local_408.m_floats._0_8_ = &PTR__cbtConvexPenetrationDepthSolver_00b4bd00;
    local_2b0 = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              ((cbtContinuousConvexCollision *)local_3e8,castShape,(cbtConvexShape *)plane,
               (cbtVoronoiSimplexSolver *)local_198,(cbtConvexPenetrationDepthSolver *)&local_408);
    iVar13 = (**(_func_int **)((long)local_3e8 + 0x10))
                       (local_3e8,convexFromTrans,convexToTrans,this,this,local_368);
    if ((char)iVar13 != '\0') {
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_2e0;
      fVar8 = SUB84(local_2e0,0);
      auVar32._0_4_ = fVar8 * fVar8;
      fVar70 = (float)((ulong)local_2e0 >> 0x20);
      auVar32._4_4_ = fVar70 * fVar70;
      auVar32._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar32);
      auVar20 = vfmadd231ss_fma(auVar20,auVar23,auVar23);
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fStack_2d8),ZEXT416((uint)fStack_2d8));
      if ((0.0001 < auVar20._0_4_) && (local_2c0 < resultCallback->m_closestHitFraction)) {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar41 = 1.0 / auVar20._0_4_;
        auVar24._0_4_ = fVar8 * fVar41;
        auVar24._4_4_ = fVar70 * fVar41;
        auVar24._8_4_ = fVar41 * 0.0;
        auVar24._12_4_ = fVar41 * 0.0;
        local_398 = (cbtConvexPenetrationDepthSolver *)vmovlps_avx(auVar24);
        fStack_2d8 = fStack_2d8 * fVar41;
        pcStack_390 = (cbtConvexShape *)CONCAT44(uStack_2d4,fStack_2d8);
        local_3a8 = (undefined1  [8])colObjWrap->m_collisionObject;
        uStack_3a0 = (cbtVoronoiSimplexSolver *)0x0;
        local_388 = local_2d0;
        uStack_380 = (undefined4)uStack_2c8;
        uStack_37c = (undefined4)((ulong)uStack_2c8 >> 0x20);
        local_378 = local_2c0;
        local_2e0 = local_398;
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,local_3a8,1);
      }
    }
    this_01 = (cbtConvexCast *)local_3e8;
  }
  else {
    if (10 < iVar13 - 0x19U) {
      if (iVar13 != 0x25) {
        return;
      }
      CProfileSample::CProfileSample((CProfileSample *)&local_3b8,"convexSweepCompound");
      cbtTransform::inverse(this);
      auVar19._4_4_ = local_368._4_4_;
      auVar19._0_4_ = local_368._4_4_;
      auVar19._8_4_ = local_368._4_4_;
      auVar19._12_4_ = local_368._4_4_;
      auVar56._4_4_ = local_358._4_4_;
      auVar56._0_4_ = local_358._4_4_;
      auVar56._8_4_ = local_358._4_4_;
      auVar56._12_4_ = local_358._4_4_;
      auVar64._4_4_ = fStack_344;
      auVar64._0_4_ = fStack_344;
      auVar64._8_4_ = fStack_344;
      auVar64._12_4_ = fStack_344;
      fVar8 = (convexFromTrans->m_basis).m_el[1].m_floats[2];
      auVar46._4_4_ = local_368._0_4_;
      auVar46._0_4_ = local_368._0_4_;
      auVar46._8_4_ = local_368._0_4_;
      auVar46._12_4_ = local_368._0_4_;
      auVar59._4_4_ = (cbtScalar)local_358;
      auVar59._0_4_ = (cbtScalar)local_358;
      auVar59._8_4_ = (cbtScalar)local_358;
      auVar59._12_4_ = (cbtScalar)local_358;
      auVar66._4_4_ = local_348;
      auVar66._0_4_ = local_348;
      auVar66._8_4_ = local_348;
      auVar66._12_4_ = local_348;
      cVar21 = (convexFromTrans->m_basis).m_el[0].m_floats[2];
      auVar53._4_4_ = pcStack_360._0_4_;
      auVar53._0_4_ = pcStack_360._0_4_;
      auVar53._8_4_ = pcStack_360._0_4_;
      auVar53._12_4_ = pcStack_360._0_4_;
      auVar62._4_4_ = pcStack_350._0_4_;
      auVar62._0_4_ = pcStack_350._0_4_;
      auVar62._8_4_ = pcStack_350._0_4_;
      auVar62._12_4_ = pcStack_350._0_4_;
      cVar22 = (convexFromTrans->m_basis).m_el[2].m_floats[2];
      fVar70 = (convexFromTrans->m_origin).m_floats[1];
      cVar4 = (convexFromTrans->m_origin).m_floats[2];
      auVar18 = vmulss_avx512f(auVar56,ZEXT416((uint)fVar70));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)((float)local_368._4_4_ * fVar8)),
                                ZEXT416((uint)cVar21),auVar46);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_358._4_4_)),ZEXT416((uint)cVar21),
                                auVar59);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fStack_344 * fVar8)),auVar66,ZEXT416((uint)cVar21));
      auVar34._4_4_ = acStack_340[0];
      auVar34._0_4_ = acStack_340[0];
      auVar34._8_4_ = acStack_340[0];
      auVar34._12_4_ = acStack_340[0];
      auVar27 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar22),auVar53);
      auVar9 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar22),auVar62);
      auVar17 = vfmadd231ss_fma(auVar17,auVar34,ZEXT416((uint)cVar22));
      cVar21 = (convexFromTrans->m_origin).m_floats[0];
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * (float)local_368._4_4_)),
                                ZEXT416((uint)cVar21),auVar46);
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar21),auVar59);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fStack_344 * fVar70)),auVar66,ZEXT416((uint)cVar21));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar4),auVar53);
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar4),auVar62);
      auVar18 = vaddss_avx512f(auVar18,ZEXT416((uint)fStack_334));
      auVar16 = vfmadd231ss_fma(auVar16,auVar34,ZEXT416((uint)cVar4));
      uVar6 = *(ulong *)(convexFromTrans->m_basis).m_el[1].m_floats;
      auVar71._8_8_ = 0;
      auVar71._0_8_ = *(ulong *)(convexFromTrans->m_basis).m_el[2].m_floats;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = uVar6;
      auVar19 = vmulps_avx512vl(auVar19,auVar74);
      auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ + local_338)),auVar18,0x10);
      local_168 = vinsertps_avx(auVar20,ZEXT416((uint)(auVar16._0_4_ + afStack_330[0])),0x28);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = *(ulong *)(convexFromTrans->m_basis).m_el[0].m_floats;
      auVar20 = vfmadd231ps_fma(auVar19,auVar18,auVar46);
      auVar20 = vfmadd231ps_fma(auVar20,auVar71,auVar53);
      auVar16 = vmulps_avx512vl(auVar74,auVar56);
      auVar16 = vfmadd231ps_fma(auVar16,auVar18,auVar59);
      local_198._0_8_ = vmovlps_avx(auVar20);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar6;
      auVar20 = vmulps_avx512vl(auVar20,auVar64);
      local_198._12_4_ = 0;
      local_198._8_4_ = auVar27._0_4_;
      auVar20 = vfmadd231ps_fma(auVar20,auVar18,auVar66);
      auVar16 = vfmadd231ps_fma(auVar16,auVar71,auVar62);
      auVar20 = vfmadd231ps_fma(auVar20,auVar71,auVar34);
      local_188 = (cbtConvexShape *)vmovlps_avx(auVar16);
      local_180 = (cbtTransform *)(ulong)auVar9._0_4_;
      local_178 = (cbtTransform *)vmovlps_avx(auVar20);
      local_170 = auVar17._0_4_;
      local_16c = 0.0;
      (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (castShape,local_198,local_3a8,local_3e8);
      cbtTransform::inverse(this);
      auVar28._4_4_ = local_368._4_4_;
      auVar28._0_4_ = local_368._4_4_;
      auVar28._8_4_ = local_368._4_4_;
      auVar28._12_4_ = local_368._4_4_;
      auVar57._4_4_ = local_358._4_4_;
      auVar57._0_4_ = local_358._4_4_;
      auVar57._8_4_ = local_358._4_4_;
      auVar57._12_4_ = local_358._4_4_;
      auVar65._4_4_ = fStack_344;
      auVar65._0_4_ = fStack_344;
      auVar65._8_4_ = fStack_344;
      auVar65._12_4_ = fStack_344;
      fVar8 = (convexToTrans->m_basis).m_el[1].m_floats[2];
      auVar47._4_4_ = local_368._0_4_;
      auVar47._0_4_ = local_368._0_4_;
      auVar47._8_4_ = local_368._0_4_;
      auVar47._12_4_ = local_368._0_4_;
      auVar60._4_4_ = (cbtScalar)local_358;
      auVar60._0_4_ = (cbtScalar)local_358;
      auVar60._8_4_ = (cbtScalar)local_358;
      auVar60._12_4_ = (cbtScalar)local_358;
      auVar67._4_4_ = local_348;
      auVar67._0_4_ = local_348;
      auVar67._8_4_ = local_348;
      auVar67._12_4_ = local_348;
      cVar21 = (convexToTrans->m_basis).m_el[0].m_floats[2];
      auVar54._4_4_ = pcStack_360._0_4_;
      auVar54._0_4_ = pcStack_360._0_4_;
      auVar54._8_4_ = pcStack_360._0_4_;
      auVar54._12_4_ = pcStack_360._0_4_;
      auVar63._4_4_ = pcStack_350._0_4_;
      auVar63._0_4_ = pcStack_350._0_4_;
      auVar63._8_4_ = pcStack_350._0_4_;
      auVar63._12_4_ = pcStack_350._0_4_;
      cVar22 = (convexToTrans->m_basis).m_el[2].m_floats[2];
      fVar70 = (convexToTrans->m_origin).m_floats[1];
      cVar4 = (convexToTrans->m_origin).m_floats[2];
      auVar18 = vmulss_avx512f(auVar57,ZEXT416((uint)fVar70));
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)((float)local_368._4_4_ * fVar8)),
                                ZEXT416((uint)cVar21),auVar47);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_358._4_4_)),ZEXT416((uint)cVar21),
                                auVar60);
      auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fStack_344 * fVar8)),auVar67,ZEXT416((uint)cVar21));
      auVar35._4_4_ = acStack_340[0];
      auVar35._0_4_ = acStack_340[0];
      auVar35._8_4_ = acStack_340[0];
      auVar35._12_4_ = acStack_340[0];
      auVar27 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar22),auVar54);
      auVar9 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar22),auVar63);
      auVar17 = vfmadd231ss_fma(auVar17,auVar35,ZEXT416((uint)cVar22));
      cVar21 = (convexToTrans->m_origin).m_floats[0];
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar70 * (float)local_368._4_4_)),
                                ZEXT416((uint)cVar21),auVar47);
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar21),auVar60);
      auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fStack_344 * fVar70)),auVar67,ZEXT416((uint)cVar21));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar4),auVar54);
      auVar18 = vfmadd231ss_avx512f(auVar18,ZEXT416((uint)cVar4),auVar63);
      auVar18 = vaddss_avx512f(auVar18,ZEXT416((uint)fStack_334));
      auVar16 = vfmadd231ss_fma(auVar16,auVar35,ZEXT416((uint)cVar4));
      uVar6 = *(ulong *)(convexToTrans->m_basis).m_el[1].m_floats;
      auVar72._8_8_ = 0;
      auVar72._0_8_ = *(ulong *)(convexToTrans->m_basis).m_el[2].m_floats;
      auVar75._8_8_ = 0;
      auVar75._0_8_ = uVar6;
      auVar19 = vmulps_avx512vl(auVar28,auVar75);
      auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ + local_338)),auVar18,0x10);
      local_168 = vinsertps_avx(auVar20,ZEXT416((uint)(auVar16._0_4_ + afStack_330[0])),0x28);
      auVar68._8_8_ = 0;
      auVar68._0_8_ = *(ulong *)(convexToTrans->m_basis).m_el[0].m_floats;
      auVar20 = vfmadd231ps_fma(auVar19,auVar68,auVar47);
      auVar20 = vfmadd231ps_fma(auVar20,auVar72,auVar54);
      auVar16 = vmulps_avx512vl(auVar75,auVar57);
      auVar16 = vfmadd231ps_fma(auVar16,auVar68,auVar60);
      local_198._0_8_ = vmovlps_avx(auVar20);
      auVar76._8_8_ = 0;
      auVar76._0_8_ = uVar6;
      auVar20 = vmulps_avx512vl(auVar76,auVar65);
      local_198._12_4_ = 0;
      local_198._8_4_ = auVar27._0_4_;
      auVar20 = vfmadd231ps_fma(auVar20,auVar68,auVar67);
      auVar16 = vfmadd231ps_fma(auVar16,auVar72,auVar63);
      auVar20 = vfmadd231ps_fma(auVar20,auVar72,auVar35);
      local_188 = (cbtConvexShape *)vmovlps_avx(auVar16);
      local_180 = (cbtTransform *)(ulong)auVar9._0_4_;
      local_178 = (cbtTransform *)vmovlps_avx(auVar20);
      local_170 = auVar17._0_4_;
      local_16c = 0.0;
      (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                (castShape,local_198,&local_408,&local_418);
      if (local_408.m_floats[0] < (float)local_3a8._0_4_) {
        local_3a8._0_4_ = local_408.m_floats[0];
      }
      if (local_408.m_floats[1] < (float)local_3a8._4_4_) {
        local_3a8._4_4_ = local_408.m_floats[1];
      }
      if (local_408.m_floats[2] < (float)uStack_3a0) {
        uStack_3a0 = (cbtVoronoiSimplexSolver *)CONCAT44(uStack_3a0._4_4_,local_408.m_floats[2]);
      }
      if (local_408.m_floats[3] < uStack_3a0._4_4_) {
        uStack_3a0 = (cbtVoronoiSimplexSolver *)CONCAT44(local_408.m_floats[3],(float)uStack_3a0);
      }
      if ((float)local_3e8._0_4_ < local_418.m_floats[0]) {
        local_3e8._0_4_ = local_418.m_floats[0];
      }
      if ((float)local_3e8._4_4_ < local_418.m_floats[1]) {
        local_3e8._4_4_ = local_418.m_floats[1];
      }
      if ((float)uStack_3e0 < local_418.m_floats[2]) {
        uStack_3e0._0_4_ = local_418.m_floats[2];
      }
      if (uStack_3e0._4_4_ < local_418.m_floats[3]) {
        uStack_3e0._4_4_ = local_418.m_floats[3];
      }
      local_198._0_8_ = &PTR__ICollide_00b47f78;
      local_168._8_8_ = this;
      local_168._0_8_ = plane;
      this_00 = *(cbtDbvt **)((plane->m_localScaling).m_floats + 3);
      local_198._8_8_ = colObjWrap;
      local_188 = castShape;
      local_180 = convexFromTrans;
      local_178 = convexToTrans;
      local_170 = allowedPenetration;
      local_158 = resultCallback;
      if (this_00 == (cbtDbvt *)0x0) {
        if (0 < (int)(plane->m_localAabbMin).m_floats[1]) {
          lVar14 = 0x40;
          lVar15 = 0;
          do {
            lVar7 = *(long *)(plane->m_localAabbMax).m_floats;
            puVar1 = (undefined8 *)(lVar7 + -0x40 + lVar14);
            local_368 = (undefined1  [8])*puVar1;
            pcStack_360 = (cbtVoronoiSimplexSolver *)puVar1[1];
            puVar2 = (ulong *)(lVar7 + -0x30 + lVar14);
            local_358 = (_func_int **)*puVar2;
            pcStack_350 = (cbtVoronoiSimplexSolver *)puVar2[1];
            pcVar3 = (cbtScalar *)(lVar7 + -0x20 + lVar14);
            _local_348 = *(undefined8 *)pcVar3;
            acStack_340 = *(cbtScalar (*) [2])(pcVar3 + 2);
            pcVar3 = (cbtScalar *)(lVar7 + -0x10 + lVar14);
            _local_338 = *(undefined8 *)pcVar3;
            afStack_330._0_8_ = *(undefined8 *)(pcVar3 + 2);
            objectQuerySingleInternal::cbtCompoundLeafCallback::ProcessChild
                      ((cbtCompoundLeafCallback *)local_198,(int)lVar15,(cbtTransform *)local_368,
                       *(cbtCollisionShape **)(lVar7 + lVar14));
            lVar15 = lVar15 + 1;
            lVar14 = lVar14 + 0x58;
          } while (lVar15 < (int)(plane->m_localAabbMin).m_floats[1]);
        }
      }
      else {
        local_368 = local_3a8;
        pcStack_360 = uStack_3a0;
        local_358 = (_func_int **)local_3e8;
        pcStack_350 = uStack_3e0;
        cbtDbvt::collideTV(this_00,this_00->m_root,(cbtDbvtVolume *)local_368,(ICollide *)local_198)
        ;
      }
      CProfileSample::~CProfileSample((CProfileSample *)&local_3b8);
      return;
    }
    if (iVar13 != 0x22) {
      local_c0 = allowedPenetration;
      local_b8 = resultCallback;
      local_a8 = plane;
      if (iVar13 == 0x19) {
        cbtTransform::inverse(this);
        auVar33._4_4_ = local_358._4_4_;
        auVar33._0_4_ = local_358._4_4_;
        auVar33._8_4_ = local_358._4_4_;
        auVar33._12_4_ = local_358._4_4_;
        fVar8 = (convexFromTrans->m_origin).m_floats[1];
        auVar49._4_4_ = local_368._0_4_;
        auVar49._0_4_ = local_368._0_4_;
        auVar49._8_4_ = local_368._0_4_;
        auVar49._12_4_ = local_368._0_4_;
        auVar37._4_4_ = (cbtScalar)local_358;
        auVar37._0_4_ = (cbtScalar)local_358;
        auVar37._8_4_ = (cbtScalar)local_358;
        auVar37._12_4_ = (cbtScalar)local_358;
        auVar45._4_4_ = local_348;
        auVar45._0_4_ = local_348;
        auVar45._8_4_ = local_348;
        auVar45._12_4_ = local_348;
        cVar21 = (convexFromTrans->m_origin).m_floats[0];
        auVar55._4_4_ = pcStack_360._0_4_;
        auVar55._0_4_ = pcStack_360._0_4_;
        auVar55._8_4_ = pcStack_360._0_4_;
        auVar55._12_4_ = pcStack_360._0_4_;
        auVar52._4_4_ = pcStack_350._0_4_;
        auVar52._0_4_ = pcStack_350._0_4_;
        auVar52._8_4_ = pcStack_350._0_4_;
        auVar52._12_4_ = pcStack_350._0_4_;
        cVar22 = (convexFromTrans->m_origin).m_floats[2];
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (float)local_368._4_4_)),
                                  ZEXT416((uint)cVar21),auVar49);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_358._4_4_)),ZEXT416((uint)cVar21),
                                  auVar37);
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fStack_344)),auVar45,ZEXT416((uint)cVar21))
        ;
        auVar58._4_4_ = acStack_340[0];
        auVar58._0_4_ = acStack_340[0];
        auVar58._8_4_ = acStack_340[0];
        auVar58._12_4_ = acStack_340[0];
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar22),auVar52);
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar22),auVar55);
        auVar17 = vfmadd231ss_fma(auVar17,auVar58,ZEXT416((uint)cVar22));
        auVar20 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ + local_338)),
                                ZEXT416((uint)(auVar16._0_4_ + fStack_334)),0x10);
        _local_3e8 = (cbtScalar  [4])
                     vinsertps_avx(auVar20,ZEXT416((uint)(auVar17._0_4_ + afStack_330[0])),0x28);
        fVar8 = (convexToTrans->m_origin).m_floats[1];
        cVar21 = (convexToTrans->m_origin).m_floats[0];
        cVar22 = (convexToTrans->m_origin).m_floats[2];
        auVar16 = vmulss_avx512f(auVar33,ZEXT416((uint)fVar8));
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (float)local_368._4_4_)),
                                  ZEXT416((uint)cVar21),auVar49);
        auVar17 = vfmadd231ss_avx512f(auVar16,ZEXT416((uint)cVar21),auVar37);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fStack_344)),auVar45,ZEXT416((uint)cVar21))
        ;
        auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar22),auVar55);
        auVar17 = vfmadd231ss_avx512f(auVar17,ZEXT416((uint)cVar22),auVar52);
        auVar16 = vfmadd231ss_fma(auVar16,auVar58,ZEXT416((uint)cVar22));
        auVar17 = vaddss_avx512f(ZEXT416((uint)fStack_334),auVar17);
        auVar20 = vinsertps_avx(ZEXT416((uint)(local_338 + auVar20._0_4_)),auVar17,0x10);
        local_408.m_floats =
             (cbtScalar  [4])
             vinsertps_avx(auVar20,ZEXT416((uint)(afStack_330[0] + auVar16._0_4_)),0x28);
        fVar8 = (convexToTrans->m_basis).m_el[1].m_floats[2];
        cVar21 = (convexToTrans->m_basis).m_el[0].m_floats[2];
        uVar5 = *(undefined8 *)(convexToTrans->m_basis).m_el[1].m_floats;
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)(convexToTrans->m_basis).m_el[2].m_floats;
        cVar22 = (convexToTrans->m_basis).m_el[2].m_floats[2];
        fVar70 = (float)uVar5;
        auVar25._0_4_ = fVar70 * (float)local_368._4_4_;
        fVar41 = (float)((ulong)uVar5 >> 0x20);
        auVar25._4_4_ = fVar41 * (float)local_368._4_4_;
        auVar25._8_4_ = (float)local_368._4_4_ * 0.0;
        auVar25._12_4_ = (float)local_368._4_4_ * 0.0;
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * (float)local_368._4_4_)),
                                  ZEXT416((uint)cVar21),auVar49);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * local_358._4_4_)),ZEXT416((uint)cVar21),
                                  auVar37);
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar8 * fStack_344)),auVar45,ZEXT416((uint)cVar21))
        ;
        auVar61._8_8_ = 0;
        auVar61._0_8_ = *(ulong *)(convexToTrans->m_basis).m_el[0].m_floats;
        auVar27 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar22),auVar55);
        auVar16 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar22),auVar52);
        auVar17 = vfmadd231ss_fma(auVar17,auVar58,ZEXT416((uint)cVar22));
        auVar20 = vfmadd231ps_fma(auVar25,auVar61,auVar49);
        auVar20 = vfmadd231ps_fma(auVar20,auVar69,auVar55);
        local_3a8 = (undefined1  [8])vmovlps_avx(auVar20);
        auVar26._0_4_ = fVar70 * local_358._4_4_;
        auVar26._4_4_ = fVar41 * local_358._4_4_;
        auVar26._8_4_ = local_358._4_4_ * 0.0;
        auVar26._12_4_ = local_358._4_4_ * 0.0;
        uStack_3a0 = (cbtVoronoiSimplexSolver *)(ulong)auVar27._0_4_;
        auVar20 = vfmadd231ps_fma(auVar26,auVar61,auVar37);
        auVar20 = vfmadd231ps_fma(auVar20,auVar69,auVar52);
        local_398 = (cbtConvexPenetrationDepthSolver *)vmovlps_avx(auVar20);
        auVar27._0_4_ = fVar70 * fStack_344;
        auVar27._4_4_ = fVar41 * fStack_344;
        auVar27._8_4_ = fStack_344 * 0.0;
        auVar27._12_4_ = fStack_344 * 0.0;
        pcStack_390 = (cbtConvexShape *)(ulong)auVar16._0_4_;
        auVar20 = vfmadd231ps_fma(auVar27,auVar61,auVar45);
        auVar20 = vfmadd231ps_fma(auVar20,auVar69,auVar58);
        local_388 = (cbtConvexShape *)vmovlps_avx(auVar20);
        uStack_37c = 0;
        cVar21 = 0.0;
        uStack_380 = auVar17._0_4_;
        local_36c = 0;
        local_378 = 0.0;
        uStack_374 = SUB168(ZEXT816(0),4);
        local_3f8 = colObjWrap->m_collisionObject;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)local_198,castShape,convexFromTrans,
                   convexToTrans,this,cVar21);
        local_198._0_8_ = &PTR__cbtTriangleCallback_00b47ee8;
        local_b0 = local_3f8;
        local_c8 = resultCallback->m_closestHitFraction;
        (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (castShape,local_3a8,&local_418,&local_3b8);
        cbtBvhTriangleMeshShape::performConvexcast
                  ((cbtBvhTriangleMeshShape *)plane,(cbtTriangleCallback *)local_198,
                   (cbtVector3 *)local_3e8,&local_408,&local_418,&local_3b8);
      }
      else {
        cbtTransform::inverse(this);
        local_208 = (convexFromTrans->m_origin).m_floats[1];
        local_1a8._4_4_ = fStack_344;
        local_1a8._0_4_ = fStack_344;
        local_1a8._8_4_ = fStack_344;
        local_1a8._12_4_ = fStack_344;
        fVar8 = (convexToTrans->m_basis).m_el[1].m_floats[2];
        local_1b8._4_4_ = local_348;
        local_1b8._0_4_ = local_348;
        local_1b8._8_4_ = local_348;
        local_1b8._12_4_ = local_348;
        local_268._4_4_ = local_368._0_4_;
        local_268._0_4_ = local_368._0_4_;
        local_268._8_4_ = local_368._0_4_;
        local_268._12_4_ = local_368._0_4_;
        local_298._4_4_ = (cbtScalar)local_358;
        local_298._0_4_ = (cbtScalar)local_358;
        local_298._8_4_ = (cbtScalar)local_358;
        local_298._12_4_ = (cbtScalar)local_358;
        local_1c8._4_4_ = acStack_340[0];
        local_1c8._0_4_ = acStack_340[0];
        local_1c8._8_4_ = acStack_340[0];
        local_1c8._12_4_ = acStack_340[0];
        local_248._4_4_ = pcStack_360._0_4_;
        local_248._0_4_ = pcStack_360._0_4_;
        local_248._8_4_ = pcStack_360._0_4_;
        local_248._12_4_ = pcStack_360._0_4_;
        local_278._4_4_ = pcStack_350._0_4_;
        local_278._0_4_ = pcStack_350._0_4_;
        local_278._8_4_ = pcStack_350._0_4_;
        local_278._12_4_ = pcStack_350._0_4_;
        cVar21 = (convexToTrans->m_basis).m_el[2].m_floats[2];
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)(convexToTrans->m_basis).m_el[2].m_floats;
        local_1e8 = (convexFromTrans->m_origin).m_floats[0];
        local_258 = (float)local_368._4_4_;
        fStack_254 = (float)local_368._4_4_;
        fStack_250 = (float)local_368._4_4_;
        fStack_24c = (float)local_368._4_4_;
        local_288 = local_358._4_4_;
        fStack_284 = local_358._4_4_;
        fStack_280 = local_358._4_4_;
        fStack_27c = local_358._4_4_;
        local_1d8 = (convexFromTrans->m_origin).m_floats[2];
        local_3ec = afStack_330[0];
        local_238 = (convexToTrans->m_origin).m_floats[1];
        local_218 = (convexToTrans->m_origin).m_floats[0];
        local_1f8 = local_338;
        fStack_1f4 = fStack_334;
        uStack_1f0 = 0;
        local_228 = (convexToTrans->m_origin).m_floats[2];
        cVar22 = (convexToTrans->m_basis).m_el[0].m_floats[2];
        auVar20 = vfmadd231ss_fma(ZEXT416((uint)((float)local_368._4_4_ * fVar8)),
                                  ZEXT416((uint)cVar22),local_268);
        auVar16 = vfmadd231ss_fma(ZEXT416((uint)(local_358._4_4_ * fVar8)),ZEXT416((uint)cVar22),
                                  local_298);
        auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fStack_344 * fVar8)),local_1b8,
                                  ZEXT416((uint)cVar22));
        uVar6 = *(ulong *)(convexToTrans->m_basis).m_el[0].m_floats;
        auVar31._8_8_ = 0;
        auVar31._0_8_ = uVar6;
        cVar22 = (cbtScalar)uVar6;
        auVar27 = vfmadd231ss_fma(auVar20,ZEXT416((uint)cVar21),local_248);
        auVar9 = vfmadd231ss_fma(auVar16,ZEXT416((uint)cVar21),local_278);
        auVar17 = vfmadd231ss_fma(auVar17,local_1c8,ZEXT416((uint)cVar21));
        uVar5 = *(undefined8 *)(convexToTrans->m_basis).m_el[1].m_floats;
        fVar8 = (float)uVar5;
        auVar50._0_4_ = (float)local_368._4_4_ * fVar8;
        fVar70 = (float)((ulong)uVar5 >> 0x20);
        auVar50._4_4_ = (float)local_368._4_4_ * fVar70;
        auVar50._8_4_ = (float)local_368._4_4_ * 0.0;
        auVar50._12_4_ = (float)local_368._4_4_ * 0.0;
        auVar20 = vfmadd231ps_fma(auVar50,auVar31,local_268);
        auVar20 = vfmadd231ps_fma(auVar20,auVar73,local_248);
        local_3a8 = (undefined1  [8])vmovlps_avx(auVar20);
        auVar51._0_4_ = local_358._4_4_ * fVar8;
        auVar51._4_4_ = local_358._4_4_ * fVar70;
        auVar51._8_4_ = local_358._4_4_ * 0.0;
        auVar51._12_4_ = local_358._4_4_ * 0.0;
        auVar42._0_4_ = fStack_344 * fVar8;
        auVar42._4_4_ = fStack_344 * fVar70;
        auVar42._8_4_ = fStack_344 * 0.0;
        auVar42._12_4_ = fStack_344 * 0.0;
        uStack_3a0 = (cbtVoronoiSimplexSolver *)(ulong)auVar27._0_4_;
        auVar20 = vfmadd231ps_fma(auVar51,auVar31,local_298);
        auVar16 = vfmadd231ps_fma(auVar42,local_1b8,auVar31);
        auVar20 = vfmadd231ps_fma(auVar20,auVar73,local_278);
        auVar16 = vfmadd231ps_fma(auVar16,local_1c8,auVar73);
        local_398 = (cbtConvexPenetrationDepthSolver *)vmovlps_avx(auVar20);
        pcStack_390 = (cbtConvexShape *)(ulong)auVar9._0_4_;
        local_388 = (cbtConvexShape *)vmovlps_avx(auVar16);
        uStack_380 = auVar17._0_4_;
        uStack_37c = 0;
        local_378 = 0.0;
        uStack_374 = 0;
        local_36c = 0;
        local_3f8 = colObjWrap->m_collisionObject;
        cStack_234 = local_238;
        cStack_230 = local_238;
        cStack_22c = local_238;
        cStack_224 = local_228;
        cStack_220 = local_228;
        cStack_21c = local_228;
        cStack_214 = local_218;
        cStack_210 = local_218;
        cStack_20c = local_218;
        cStack_204 = local_208;
        cStack_200 = local_208;
        cStack_1fc = local_208;
        cStack_1e4 = local_1e8;
        cStack_1e0 = local_1e8;
        cStack_1dc = local_1e8;
        cStack_1d4 = local_1d8;
        cStack_1d0 = local_1d8;
        cStack_1cc = local_1d8;
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0xc])
                  (plane);
        cbtTriangleConvexcastCallback::cbtTriangleConvexcastCallback
                  ((cbtTriangleConvexcastCallback *)local_198,castShape,convexFromTrans,
                   convexToTrans,this,cVar22);
        local_198._0_8_ = &PTR__cbtTriangleCallback_00b47f30;
        local_b0 = local_3f8;
        local_c8 = resultCallback->m_closestHitFraction;
        (*(castShape->super_cbtCollisionShape)._vptr_cbtCollisionShape[2])
                  (castShape,local_3a8,local_3e8,&local_408);
        auVar16._4_4_ = fStack_254;
        auVar16._0_4_ = local_258;
        auVar16._8_4_ = fStack_250;
        auVar16._12_4_ = fStack_24c;
        auVar17._4_4_ = cStack_1e4;
        auVar17._0_4_ = local_1e8;
        auVar17._8_4_ = cStack_1e0;
        auVar17._12_4_ = cStack_1dc;
        auVar9._4_4_ = cStack_214;
        auVar9._0_4_ = local_218;
        auVar9._8_4_ = cStack_210;
        auVar9._12_4_ = cStack_20c;
        auVar11._4_4_ = cStack_1d4;
        auVar11._0_4_ = local_1d8;
        auVar11._8_4_ = cStack_1d0;
        auVar11._12_4_ = cStack_1cc;
        auVar10._4_4_ = cStack_224;
        auVar10._0_4_ = local_228;
        auVar10._8_4_ = cStack_220;
        auVar10._12_4_ = cStack_21c;
        auVar20 = vinsertps_avx(auVar16,ZEXT416((uint)local_288),0x1c);
        auVar16 = vinsertps_avx(local_268,ZEXT416((uint)local_298._0_4_),0x1c);
        auVar38._0_4_ = local_208 * auVar20._0_4_;
        auVar38._4_4_ = cStack_204 * auVar20._4_4_;
        auVar38._8_4_ = cStack_200 * auVar20._8_4_;
        auVar38._12_4_ = cStack_1fc * auVar20._12_4_;
        auVar43._0_4_ = local_238 * auVar20._0_4_;
        auVar43._4_4_ = cStack_234 * auVar20._4_4_;
        auVar43._8_4_ = cStack_230 * auVar20._8_4_;
        auVar43._12_4_ = cStack_22c * auVar20._12_4_;
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)(local_208 * (float)local_1a8._0_4_)),auVar17,
                                  local_1b8);
        auVar17 = vfmadd231ps_fma(auVar38,auVar16,auVar17);
        auVar16 = vfmadd231ps_fma(auVar43,auVar9,auVar16);
        auVar20 = vinsertps_avx(local_248,ZEXT416((uint)local_278._0_4_),0x1c);
        auVar27 = vfmadd231ss_fma(auVar27,auVar11,local_1c8);
        auVar9 = vfmadd231ss_fma(ZEXT416((uint)(local_238 * (float)local_1a8._0_4_)),auVar9,
                                 local_1b8);
        fVar8 = auVar27._0_4_ + local_3ec;
        auVar27 = vfmadd231ss_fma(auVar9,auVar10,local_1c8);
        auVar17 = vfmadd231ps_fma(auVar17,auVar20,auVar11);
        auVar20 = vfmadd231ps_fma(auVar16,auVar10,auVar20);
        auVar39._0_4_ = local_1f8 + auVar17._0_4_;
        auVar39._4_4_ = fStack_1f4 + auVar17._4_4_;
        auVar39._8_4_ = (float)uStack_1f0 + auVar17._8_4_;
        auVar39._12_4_ = uStack_1f0._4_4_ + auVar17._12_4_;
        auVar44._0_4_ = local_1f8 + auVar20._0_4_;
        auVar44._4_4_ = fStack_1f4 + auVar20._4_4_;
        auVar44._8_4_ = (float)uStack_1f0 + auVar20._8_4_;
        auVar44._12_4_ = uStack_1f0._4_4_ + auVar20._12_4_;
        auVar20 = vmovlhps_avx(auVar39,ZEXT416((uint)fVar8));
        auVar16 = auVar39;
        if (auVar44._0_4_ < auVar39._0_4_) {
          auVar16 = auVar44;
        }
        auVar17 = vmovshdup_avx(auVar39);
        auVar9 = vmovshdup_avx(auVar44);
        if (auVar9._0_4_ < auVar17._0_4_) {
          auVar17 = auVar9;
        }
        auVar16 = vinsertps_avx(auVar16,auVar17,0x10);
        auVar17 = ZEXT416((uint)(local_3ec + auVar27._0_4_));
        auVar9 = vminss_avx(auVar17,ZEXT416((uint)fVar8));
        auVar27 = vmaxss_avx(auVar17,ZEXT416((uint)fVar8));
        auVar17 = vmaxps_avx(auVar44,auVar39);
        auVar48._0_4_ = local_3e8._0_4_ + auVar16._0_4_;
        auVar48._4_4_ = local_3e8._4_4_ + auVar16._4_4_;
        auVar48._8_4_ = auVar16._8_4_ + 0.0;
        auVar48._12_4_ = auVar16._12_4_ + 0.0;
        uVar5 = vmovlps_avx(auVar48);
        local_418.m_floats[3] = auVar20._12_4_;
        local_418.m_floats[2] = auVar9._0_4_ + (float)uStack_3e0;
        local_418.m_floats[0] = (cbtScalar)(int)uVar5;
        local_418.m_floats[1] = (cbtScalar)(int)((ulong)uVar5 >> 0x20);
        auVar40._0_4_ = local_408.m_floats[0] + auVar17._0_4_;
        auVar40._4_4_ = local_408.m_floats[1] + auVar17._4_4_;
        auVar40._8_4_ = auVar17._8_4_ + 0.0;
        auVar40._12_4_ = auVar17._12_4_ + 0.0;
        auVar20 = vmovlhps_avx(auVar40,ZEXT416((uint)fVar8));
        local_3b8.m_floats[3] = auVar20._12_4_;
        local_3b8.m_floats._0_8_ = auVar20._0_8_;
        local_3b8.m_floats[2] = auVar27._0_4_ + local_408.m_floats[2];
        (*(plane->super_cbtConcaveShape).super_cbtCollisionShape._vptr_cbtCollisionShape[0x10])
                  (plane,local_198);
      }
      cbtTriangleCallback::~cbtTriangleCallback((cbtTriangleCallback *)local_198);
      return;
    }
    local_198._0_8_ = &PTR_DebugDraw_00b48020;
    local_e8[0] = 0.0;
    local_e8[1] = 0.0;
    local_dc[0] = 4.48416e-44;
    local_dc[1] = 0.0001;
    local_f0 = resultCallback->m_closestHitFraction;
    local_e8[2] = allowedPenetration;
    cbtContinuousConvexCollision::cbtContinuousConvexCollision
              ((cbtContinuousConvexCollision *)local_3a8,castShape,plane);
    cVar12 = (**(code **)((long)local_3a8 + 0x10))
                       (local_3a8,convexFromTrans,convexToTrans,this,this,local_198);
    if (cVar12 != '\0') {
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_110;
      fVar8 = SUB84(local_110,0);
      auVar36._0_4_ = fVar8 * fVar8;
      fVar70 = (float)((ulong)local_110 >> 0x20);
      auVar36._4_4_ = fVar70 * fVar70;
      auVar36._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar36);
      auVar20 = vfmadd231ss_fma(auVar20,auVar29,auVar29);
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fStack_108),ZEXT416((uint)fStack_108));
      if ((0.0001 < auVar20._0_4_) && (local_f0 < resultCallback->m_closestHitFraction)) {
        auVar20 = vsqrtss_avx(auVar20,auVar20);
        fVar41 = 1.0 / auVar20._0_4_;
        auVar30._0_4_ = fVar8 * fVar41;
        auVar30._4_4_ = fVar70 * fVar41;
        auVar30._8_4_ = fVar41 * 0.0;
        auVar30._12_4_ = fVar41 * 0.0;
        local_358 = (_func_int **)vmovlps_avx(auVar30);
        fStack_108 = fStack_108 * fVar41;
        pcStack_350 = (cbtVoronoiSimplexSolver *)CONCAT44(cStack_104,fStack_108);
        local_368 = (undefined1  [8])colObjWrap->m_collisionObject;
        pcStack_360 = (cbtVoronoiSimplexSolver *)0x0;
        local_348 = local_100[0];
        fStack_344 = local_100[1];
        acStack_340[0] = acStack_f8[0];
        acStack_340[1] = acStack_f8[1];
        local_338 = local_f0;
        local_110 = local_358;
        (*resultCallback->_vptr_ConvexResultCallback[3])(resultCallback,local_368,1);
      }
    }
    this_01 = (cbtConvexCast *)local_3a8;
  }
  cbtConvexCast::~cbtConvexCast(this_01);
  return;
}

Assistant:

void cbtCollisionWorld::objectQuerySingleInternal(const cbtConvexShape* castShape, const cbtTransform& convexFromTrans, const cbtTransform& convexToTrans,
												 const cbtCollisionObjectWrapper* colObjWrap,
												 ConvexResultCallback& resultCallback, cbtScalar allowedPenetration)
{
	const cbtCollisionShape* collisionShape = colObjWrap->getCollisionShape();
	const cbtTransform& colObjWorldTransform = colObjWrap->getWorldTransform();

	if (collisionShape->isConvex())
	{
		//BT_PROFILE("convexSweepConvex");
		cbtConvexCast::CastResult castResult;
		castResult.m_allowedPenetration = allowedPenetration;
		castResult.m_fraction = resultCallback.m_closestHitFraction;  //cbtScalar(1.);//??

		cbtConvexShape* convexShape = (cbtConvexShape*)collisionShape;
		cbtVoronoiSimplexSolver simplexSolver;
		cbtGjkEpaPenetrationDepthSolver gjkEpaPenetrationSolver;

		cbtContinuousConvexCollision convexCaster1(castShape, convexShape, &simplexSolver, &gjkEpaPenetrationSolver);
		//cbtGjkConvexCast convexCaster2(castShape,convexShape,&simplexSolver);
		//cbtSubsimplexConvexCast convexCaster3(castShape,convexShape,&simplexSolver);

		cbtConvexCast* castPtr = &convexCaster1;

		if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
		{
			//add hit
			if (castResult.m_normal.length2() > cbtScalar(0.0001))
			{
				if (castResult.m_fraction < resultCallback.m_closestHitFraction)
				{
					castResult.m_normal.normalize();
					cbtCollisionWorld::LocalConvexResult localConvexResult(
						colObjWrap->getCollisionObject(),
						0,
						castResult.m_normal,
						castResult.m_hitPoint,
						castResult.m_fraction);

					bool normalInWorldSpace = true;
					resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
				}
			}
		}
	}
	else
	{
		if (collisionShape->isConcave())
		{
			if (collisionShape->getShapeType() == TRIANGLE_MESH_SHAPE_PROXYTYPE)
			{
				//BT_PROFILE("convexSweepcbtBvhTriangleMesh");
				cbtBvhTriangleMeshShape* triangleMesh = (cbtBvhTriangleMeshShape*)collisionShape;
				cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
				cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
				cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
				// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
				cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

				//ConvexCast::CastResult
				struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
				{
					cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
					const cbtCollisionObject* m_collisionObject;
					cbtTriangleMeshShape* m_triangleMesh;

					BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
													 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtTriangleMeshShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																								m_resultCallback(resultCallback),
																																																								m_collisionObject(collisionObject),
																																																								m_triangleMesh(triangleMesh)
					{
					}

					virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
					{
						cbtCollisionWorld::LocalShapeInfo shapeInfo;
						shapeInfo.m_shapePart = partId;
						shapeInfo.m_triangleIndex = triangleIndex;
						if (hitFraction <= m_resultCallback->m_closestHitFraction)
						{
							cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																			 &shapeInfo,
																			 hitNormalLocal,
																			 hitPointLocal,
																			 hitFraction);

							bool normalInWorldSpace = true;

							return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
						}
						return hitFraction;
					}
				};

				BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), triangleMesh, colObjWorldTransform);
				tccb.m_hitFraction = resultCallback.m_closestHitFraction;
				tccb.m_allowedPenetration = allowedPenetration;
				cbtVector3 boxMinLocal, boxMaxLocal;
				castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);
				triangleMesh->performConvexcast(&tccb, convexFromLocal, convexToLocal, boxMinLocal, boxMaxLocal);
			}
			else
			{
				if (collisionShape->getShapeType() == STATIC_PLANE_PROXYTYPE)
				{
					cbtConvexCast::CastResult castResult;
					castResult.m_allowedPenetration = allowedPenetration;
					castResult.m_fraction = resultCallback.m_closestHitFraction;
					cbtStaticPlaneShape* planeShape = (cbtStaticPlaneShape*)collisionShape;
					cbtContinuousConvexCollision convexCaster1(castShape, planeShape);
					cbtConvexCast* castPtr = &convexCaster1;

					if (castPtr->calcTimeOfImpact(convexFromTrans, convexToTrans, colObjWorldTransform, colObjWorldTransform, castResult))
					{
						//add hit
						if (castResult.m_normal.length2() > cbtScalar(0.0001))
						{
							if (castResult.m_fraction < resultCallback.m_closestHitFraction)
							{
								castResult.m_normal.normalize();
								cbtCollisionWorld::LocalConvexResult localConvexResult(
									colObjWrap->getCollisionObject(),
									0,
									castResult.m_normal,
									castResult.m_hitPoint,
									castResult.m_fraction);

								bool normalInWorldSpace = true;
								resultCallback.addSingleResult(localConvexResult, normalInWorldSpace);
							}
						}
					}
				}
				else
				{
					//BT_PROFILE("convexSweepConcave");
					cbtConcaveShape* concaveShape = (cbtConcaveShape*)collisionShape;
					cbtTransform worldTocollisionObject = colObjWorldTransform.inverse();
					cbtVector3 convexFromLocal = worldTocollisionObject * convexFromTrans.getOrigin();
					cbtVector3 convexToLocal = worldTocollisionObject * convexToTrans.getOrigin();
					// rotation of box in local mesh space = MeshRotation^-1 * ConvexToRotation
					cbtTransform rotationXform = cbtTransform(worldTocollisionObject.getBasis() * convexToTrans.getBasis());

					//ConvexCast::CastResult
					struct BridgeTriangleConvexcastCallback : public cbtTriangleConvexcastCallback
					{
						cbtCollisionWorld::ConvexResultCallback* m_resultCallback;
						const cbtCollisionObject* m_collisionObject;
						cbtConcaveShape* m_triangleMesh;

						BridgeTriangleConvexcastCallback(const cbtConvexShape* castShape, const cbtTransform& from, const cbtTransform& to,
														 cbtCollisionWorld::ConvexResultCallback* resultCallback, const cbtCollisionObject* collisionObject, cbtConcaveShape* triangleMesh, const cbtTransform& triangleToWorld) : cbtTriangleConvexcastCallback(castShape, from, to, triangleToWorld, triangleMesh->getMargin()),
																																																							   m_resultCallback(resultCallback),
																																																							   m_collisionObject(collisionObject),
																																																							   m_triangleMesh(triangleMesh)
						{
						}

						virtual cbtScalar reportHit(const cbtVector3& hitNormalLocal, const cbtVector3& hitPointLocal, cbtScalar hitFraction, int partId, int triangleIndex)
						{
							cbtCollisionWorld::LocalShapeInfo shapeInfo;
							shapeInfo.m_shapePart = partId;
							shapeInfo.m_triangleIndex = triangleIndex;
							if (hitFraction <= m_resultCallback->m_closestHitFraction)
							{
								cbtCollisionWorld::LocalConvexResult convexResult(m_collisionObject,
																				 &shapeInfo,
																				 hitNormalLocal,
																				 hitPointLocal,
																				 hitFraction);

								bool normalInWorldSpace = true;

								return m_resultCallback->addSingleResult(convexResult, normalInWorldSpace);
							}
							return hitFraction;
						}
					};

					BridgeTriangleConvexcastCallback tccb(castShape, convexFromTrans, convexToTrans, &resultCallback, colObjWrap->getCollisionObject(), concaveShape, colObjWorldTransform);
					tccb.m_hitFraction = resultCallback.m_closestHitFraction;
					tccb.m_allowedPenetration = allowedPenetration;
					cbtVector3 boxMinLocal, boxMaxLocal;
					castShape->getAabb(rotationXform, boxMinLocal, boxMaxLocal);

					cbtVector3 rayAabbMinLocal = convexFromLocal;
					rayAabbMinLocal.setMin(convexToLocal);
					cbtVector3 rayAabbMaxLocal = convexFromLocal;
					rayAabbMaxLocal.setMax(convexToLocal);
					rayAabbMinLocal += boxMinLocal;
					rayAabbMaxLocal += boxMaxLocal;
					concaveShape->processAllTriangles(&tccb, rayAabbMinLocal, rayAabbMaxLocal);
				}
			}
		}
		else
		{
			if (collisionShape->isCompound())
			{
				struct cbtCompoundLeafCallback : cbtDbvt::ICollide
				{
					cbtCompoundLeafCallback(
						const cbtCollisionObjectWrapper* colObjWrap,
						const cbtConvexShape* castShape,
						const cbtTransform& convexFromTrans,
						const cbtTransform& convexToTrans,
						cbtScalar allowedPenetration,
						const cbtCompoundShape* compoundShape,
						const cbtTransform& colObjWorldTransform,
						ConvexResultCallback& resultCallback)
						: m_colObjWrap(colObjWrap),
						  m_castShape(castShape),
						  m_convexFromTrans(convexFromTrans),
						  m_convexToTrans(convexToTrans),
						  m_allowedPenetration(allowedPenetration),
						  m_compoundShape(compoundShape),
						  m_colObjWorldTransform(colObjWorldTransform),
						  m_resultCallback(resultCallback)
					{
					}

					const cbtCollisionObjectWrapper* m_colObjWrap;
					const cbtConvexShape* m_castShape;
					const cbtTransform& m_convexFromTrans;
					const cbtTransform& m_convexToTrans;
					cbtScalar m_allowedPenetration;
					const cbtCompoundShape* m_compoundShape;
					const cbtTransform& m_colObjWorldTransform;
					ConvexResultCallback& m_resultCallback;

				public:
					void ProcessChild(int index, const cbtTransform& childTrans, const cbtCollisionShape* childCollisionShape)
					{
						cbtTransform childWorldTrans = m_colObjWorldTransform * childTrans;

						struct LocalInfoAdder : public ConvexResultCallback
						{
							ConvexResultCallback* m_userCallback;
							int m_i;

							LocalInfoAdder(int i, ConvexResultCallback* user)
								: m_userCallback(user), m_i(i)
							{
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
							}
							virtual bool needsCollision(cbtBroadphaseProxy* p) const
							{
								return m_userCallback->needsCollision(p);
							}
							virtual cbtScalar addSingleResult(cbtCollisionWorld::LocalConvexResult& r, bool b)
							{
								cbtCollisionWorld::LocalShapeInfo shapeInfo;
								shapeInfo.m_shapePart = -1;
								shapeInfo.m_triangleIndex = m_i;
								if (r.m_localShapeInfo == NULL)
									r.m_localShapeInfo = &shapeInfo;
								const cbtScalar result = m_userCallback->addSingleResult(r, b);
								m_closestHitFraction = m_userCallback->m_closestHitFraction;
								return result;
							}
						};

						LocalInfoAdder my_cb(index, &m_resultCallback);

						cbtCollisionObjectWrapper tmpObj(m_colObjWrap, childCollisionShape, m_colObjWrap->getCollisionObject(), childWorldTrans, -1, index);

						objectQuerySingleInternal(m_castShape, m_convexFromTrans, m_convexToTrans, &tmpObj, my_cb, m_allowedPenetration);
					}

					void Process(const cbtDbvtNode* leaf)
					{
						// Processing leaf node
						int index = leaf->dataAsInt;

						cbtTransform childTrans = m_compoundShape->getChildTransform(index);
						const cbtCollisionShape* childCollisionShape = m_compoundShape->getChildShape(index);

						ProcessChild(index, childTrans, childCollisionShape);
					}
				};

				BT_PROFILE("convexSweepCompound");
				const cbtCompoundShape* compoundShape = static_cast<const cbtCompoundShape*>(collisionShape);

				cbtVector3 fromLocalAabbMin, fromLocalAabbMax;
				cbtVector3 toLocalAabbMin, toLocalAabbMax;

				castShape->getAabb(colObjWorldTransform.inverse() * convexFromTrans, fromLocalAabbMin, fromLocalAabbMax);
				castShape->getAabb(colObjWorldTransform.inverse() * convexToTrans, toLocalAabbMin, toLocalAabbMax);

				fromLocalAabbMin.setMin(toLocalAabbMin);
				fromLocalAabbMax.setMax(toLocalAabbMax);

				cbtCompoundLeafCallback callback(colObjWrap, castShape, convexFromTrans, convexToTrans,
												allowedPenetration, compoundShape, colObjWorldTransform, resultCallback);

				const cbtDbvt* tree = compoundShape->getDynamicAabbTree();
				if (tree)
				{
					const ATTRIBUTE_ALIGNED16(cbtDbvtVolume) bounds = cbtDbvtVolume::FromMM(fromLocalAabbMin, fromLocalAabbMax);
					tree->collideTV(tree->m_root, bounds, callback);
				}
				else
				{
					int i;
					for (i = 0; i < compoundShape->getNumChildShapes(); i++)
					{
						const cbtCollisionShape* childCollisionShape = compoundShape->getChildShape(i);
						cbtTransform childTrans = compoundShape->getChildTransform(i);
						callback.ProcessChild(i, childTrans, childCollisionShape);
					}
				}
			}
		}
	}
}